

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool __thiscall tinyusdz::Stage::replace_root_prim(Stage *this,string *prim_name,Prim *prim)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  pointer pPVar3;
  undefined1 *puVar4;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  string *psVar5;
  Prim *__args;
  undefined8 __s2;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer pPVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  pointer pPVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ostringstream ss_e;
  pointer local_228;
  string local_220;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_200;
  string local_1f8;
  string *local_1d8;
  Prim *local_1d0;
  undefined1 local_1c8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [12];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (prim_name->_M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
               0x4f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"replace_root_prim",0x11);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,699);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"prim_name is empty.","")
    ;
    fmt::format(&local_220,&local_1f8);
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_220._M_dataplus._M_p,local_220._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0032b7f3;
  }
  else {
    bVar6 = ValidatePrimElementName(prim_name);
    if (bVar6) {
      local_228 = (this->_root_nodes).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pPVar13 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_200 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)&this->_root_node_nameSet;
      local_1d0 = prim;
      if (((long)pPVar13 - (long)local_228 >> 4) * 0x21cfb2b78c13521d -
          (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_200,
                   (_Link_type)
                   (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  );
        p_Var1 = &(this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var1->_M_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var1->_M_header;
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_228 = (this->_root_nodes).
                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                    super__Vector_impl_data._M_start;
        pPVar13 = (this->_root_nodes).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pPVar13 != local_228) {
          lVar14 = 0x1a0;
          uVar15 = 0;
          do {
            this_00 = local_200;
            if (*(long *)((long)&(local_228->_abs_path)._prim_part._M_string_length + lVar14) == 0)
            {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                         ,0x4f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"replace_root_prim",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2c7);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar12 = "Internal error: Existing root Prim\'s elementName is empty.";
              lVar14 = 0x3a;
LAB_0032bb4b:
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,pcVar12,lVar14);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append
                        ((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) goto LAB_0032b7e6;
              goto LAB_0032b7f3;
            }
            sVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_200,
                            (key_type *)
                            ((long)&(local_228->_abs_path)._prim_part._M_dataplus._M_p + lVar14));
            if (sVar8 != 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                         ,0x4f);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,"replace_root_prim",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2cb);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pcVar12 = "Internal error: Stage contains root Prim with same elementName.";
              lVar14 = 0x3f;
              goto LAB_0032bb4b;
            }
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_equal<std::__cxx11::string_const&>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&(((this->_root_nodes).
                                         super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                       _prim_part + lVar14));
            uVar15 = uVar15 + 1;
            local_228 = (this->_root_nodes).
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_start;
            pPVar13 = (this->_root_nodes).
                      super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            lVar14 = lVar14 + 0x350;
          } while (uVar15 < (ulong)(((long)pPVar13 - (long)local_228 >> 4) * 0x21cfb2b78c13521d));
        }
      }
      local_50 = local_40;
      pcVar2 = (prim_name->_M_dataplus)._M_p;
      local_1d8 = prim_name;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + prim_name->_M_string_length);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_50,local_48 + (long)local_50);
      puVar4 = local_1c8 + 0x10;
      local_1c8._0_8_ = puVar4;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_1f8._M_dataplus._M_p,
                 local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_1c8._0_8_,(pointer)(local_1c8._0_8_ + local_1c8._8_8_));
      if ((undefined1 *)local_1c8._0_8_ != puVar4) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      local_1c8._0_8_ = puVar4;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1c8,local_220._M_dataplus._M_p,
                 local_220._M_dataplus._M_p + local_220._M_string_length);
      __s2 = local_1c8._0_8_;
      lVar14 = (long)pPVar13 - (long)local_228;
      lVar16 = (lVar14 >> 4) * 0x21cfb2b78c13521d >> 2;
      if (0 < lVar16) {
        lVar14 = lVar16 + 1;
        pPVar10 = local_228 + 2;
        do {
          if ((pointer)pPVar10[-2]._elementPath._prim_part._M_string_length ==
              (pointer)local_1c8._8_8_) {
            if (((pointer)local_1c8._8_8_ == (pointer)0x0) ||
               (iVar7 = bcmp(pPVar10[-2]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,
                             local_1c8._8_8_), iVar7 == 0)) {
              pPVar10 = pPVar10 + -2;
              goto LAB_0032bc42;
            }
            if ((pointer)pPVar10[-1]._elementPath._prim_part._M_string_length ==
                (pointer)local_1c8._8_8_) goto LAB_0032b5fc;
          }
          else if ((pointer)pPVar10[-1]._elementPath._prim_part._M_string_length ==
                   (pointer)local_1c8._8_8_) {
            if ((pointer)local_1c8._8_8_ != (pointer)0x0) {
LAB_0032b5fc:
              iVar7 = bcmp(pPVar10[-1]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,
                           local_1c8._8_8_);
              if (iVar7 != 0) goto LAB_0032b616;
            }
            pPVar10 = pPVar10 + -1;
            goto LAB_0032bc42;
          }
LAB_0032b616:
          if ((pointer)(pPVar10->_elementPath)._prim_part._M_string_length ==
              (pointer)local_1c8._8_8_) {
            if (((pointer)local_1c8._8_8_ == (pointer)0x0) ||
               (iVar7 = bcmp((pPVar10->_elementPath)._prim_part._M_dataplus._M_p,(void *)__s2,
                             local_1c8._8_8_), iVar7 == 0)) goto LAB_0032bc42;
            if ((pointer)pPVar10[1]._elementPath._prim_part._M_string_length ==
                (pointer)local_1c8._8_8_) {
LAB_0032b65f:
              iVar7 = bcmp(pPVar10[1]._elementPath._prim_part._M_dataplus._M_p,(void *)__s2,
                           local_1c8._8_8_);
              if (iVar7 == 0) goto LAB_0032bc2d;
            }
          }
          else if ((pointer)pPVar10[1]._elementPath._prim_part._M_string_length ==
                   (pointer)local_1c8._8_8_) {
            if ((pointer)local_1c8._8_8_ != (pointer)0x0) goto LAB_0032b65f;
LAB_0032bc2d:
            pPVar10 = pPVar10 + 1;
            goto LAB_0032bc42;
          }
          lVar14 = lVar14 + -1;
          pPVar10 = pPVar10 + 4;
        } while (1 < lVar14);
        lVar14 = (long)pPVar13 - (long)(local_228 + lVar16 * 4);
        local_228 = local_228 + lVar16 * 4;
      }
      lVar14 = (lVar14 >> 4) * 0x21cfb2b78c13521d;
      if (lVar14 == 1) {
LAB_0032bbe2:
        pPVar10 = pPVar13;
        if ((((pointer)(local_228->_elementPath)._prim_part._M_string_length ==
              (pointer)local_1c8._8_8_) &&
            (pPVar10 = local_228, (pointer)local_1c8._8_8_ != (pointer)0x0)) &&
           (iVar7 = bcmp((local_228->_elementPath)._prim_part._M_dataplus._M_p,(void *)__s2,
                         local_1c8._8_8_), iVar7 != 0)) {
LAB_0032bc13:
          pPVar10 = pPVar13;
        }
      }
      else if (lVar14 == 2) {
LAB_0032bba9:
        if (((pointer)(local_228->_elementPath)._prim_part._M_string_length !=
             (pointer)local_1c8._8_8_) ||
           ((pPVar10 = local_228, (pointer)local_1c8._8_8_ != (pointer)0x0 &&
            (iVar7 = bcmp((local_228->_elementPath)._prim_part._M_dataplus._M_p,(void *)__s2,
                          local_1c8._8_8_), iVar7 != 0)))) {
          local_228 = local_228 + 1;
          goto LAB_0032bbe2;
        }
      }
      else {
        if (lVar14 != 3) goto LAB_0032bc13;
        if (((pointer)(local_228->_elementPath)._prim_part._M_string_length !=
             (pointer)local_1c8._8_8_) ||
           ((pPVar10 = local_228, (pointer)local_1c8._8_8_ != (pointer)0x0 &&
            (iVar7 = bcmp((local_228->_elementPath)._prim_part._M_dataplus._M_p,(void *)__s2,
                          local_1c8._8_8_), iVar7 != 0)))) {
          local_228 = local_228 + 1;
          goto LAB_0032bba9;
        }
      }
LAB_0032bc42:
      local_228 = pPVar10;
      psVar5 = local_1d8;
      paVar11 = &local_220.field_2;
      if ((undefined1 *)__s2 != local_1c8 + 0x10) {
        operator_delete((void *)__s2,local_1c8._16_8_ + 1);
      }
      __args = local_1d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != paVar11) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      pPVar13 = (this->_root_nodes).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_finish;
      bVar6 = SetPrimElementName(&__args->_data,psVar5);
      if (local_228 == pPVar13) {
        if (bVar6) {
          local_220._M_dataplus._M_p = (pointer)paVar11;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
          Path::Path((Path *)local_1c8,psVar5,&local_220);
          Path::operator=(&__args->_elementPath,(Path *)local_1c8);
          if (local_128._M_p != local_1c8 + 0xb0) {
            operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
          }
          if (local_148._M_p != local_1c8 + 0x90) {
            operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
          }
          psVar5 = local_1d8;
          if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
            operator_delete((void *)local_1c8._96_8_,local_158._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
            operator_delete((void *)local_1c8._64_8_,local_1c8._80_8_ + 1);
          }
          if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
            operator_delete((void *)local_1c8._32_8_,local_1c8._48_8_ + 1);
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != paVar11) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_equal<std::__cxx11::string_const&>(local_200,psVar5);
          ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
          emplace_back<tinyusdz::Prim>(&this->_root_nodes,__args);
          goto LAB_0032c04d;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                   ,0x4f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"replace_root_prim",0x11);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
        iVar7 = 0x2e5;
      }
      else {
        if (bVar6) {
          local_220._M_dataplus._M_p = (pointer)paVar11;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
          Path::Path((Path *)local_1c8,psVar5,&local_220);
          Path::operator=(&__args->_elementPath,(Path *)local_1c8);
          if (local_128._M_p != local_1c8 + 0xb0) {
            operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
          }
          if (local_148._M_p != local_1c8 + 0x90) {
            operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
            operator_delete((void *)local_1c8._96_8_,local_158._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
            operator_delete((void *)local_1c8._64_8_,local_1c8._80_8_ + 1);
          }
          if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
            operator_delete((void *)local_1c8._32_8_,local_1c8._48_8_ + 1);
          }
          if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
            operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          Path::operator=(&local_228->_abs_path,&__args->_abs_path);
          Path::operator=(&local_228->_path,&__args->_path);
          Path::operator=(&local_228->_elementPath,&__args->_elementPath);
          ::std::__cxx11::string::operator=
                    ((string *)&local_228->_prim_type_name,(string *)&__args->_prim_type_name);
          local_228->_specifier = __args->_specifier;
          linb::any::operator=(&(local_228->_data).v_,&(__args->_data).v_);
          local_1c8._16_8_ =
               (local_228->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          pPVar3 = (__args->_children).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_1c8._0_8_ =
               (local_228->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1c8._8_8_ =
               (local_228->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish;
          (local_228->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (__args->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
          (local_228->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar3;
          (local_228->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (__args->_children).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          (__args->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__args->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__args->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector
                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)local_1c8);
          ::std::
          multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_228->_childrenNameSet,&__args->_childrenNameSet);
          bVar6 = __args->_primChildrenIndicesIsValid;
          local_228->_child_dirty = __args->_child_dirty;
          local_228->_primChildrenIndicesIsValid = bVar6;
          ::std::vector<long,_std::allocator<long>_>::_M_move_assign
                    ((vector<long,_std::allocator<long>_> *)&local_228->_primChildrenIndices,
                     &__args->_primChildrenIndices);
          local_228->_prim_id = __args->_prim_id;
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
          ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                       *)&local_228->_variantSets,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                       *)&__args->_variantSets);
LAB_0032c04d:
          this->_dirty = true;
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                   ,0x4f);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c8,"replace_root_prim",0x11);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
        iVar7 = 0x2db;
      }
      poVar9 = (ostream *)::std::ostream::operator<<((ostream *)local_1c8,iVar7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Internal error. cannot modify Prim\'s elementName.",0x31);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == paVar11) goto LAB_0032b7f3;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"replace_root_prim",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2bf);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"`{}` is not a valid Prim name.","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_220,(fmt *)&local_1f8,(string *)prim_name,in_RCX);
      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == &local_220.field_2) goto LAB_0032b7f3;
    }
  }
LAB_0032b7e6:
  operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
LAB_0032b7f3:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  return false;
}

Assistant:

bool Stage::replace_root_prim(const std::string &prim_name, Prim &&prim) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (prim_name.empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format("prim_name is empty."));
  }

  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN(fmt::format("`{}` is not a valid Prim name.", prim_name));
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_root_nodes.begin(), _root_nodes.end(), [prim_name](const Prim &p) {
    return (p.element_name() == prim_name);
  });

  if (result != _root_nodes.end()) {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    (*result) = std::move(prim); // replace

  } else {

    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(prim.get_data(), prim_name)) {
      PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
    }
    prim.element_path() = Path(prim_name, /* prop_part */"");

    _root_node_nameSet.insert(prim_name);
    _root_nodes.emplace_back(std::move(prim)); // add
  }

  _dirty = true;

  return true;
}